

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

float notch::core::internal::dot<float_const*,float_const*>
                (float *x_begin,float *x_end,float *y_begin,float *y_end)

{
  ostream *poVar1;
  invalid_argument *this;
  float fVar2;
  ostringstream what;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  if ((long)x_end - (long)x_begin >> 2 != (long)y_end - (long)y_begin >> 2) {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"stl_dot: vector sizes don\'t match:\n",0x23);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," x size = ",10);
    poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," y size = ",10);
    ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::stringbuf::str();
    ::std::invalid_argument::invalid_argument(this,asStack_1b8);
    __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
  }
  if (x_begin == x_end) {
    fVar2 = 0.0;
  }
  else {
    fVar2 = 0.0;
    do {
      fVar2 = fVar2 + *x_begin * *y_begin;
      x_begin = x_begin + 1;
      y_begin = y_begin + 1;
    } while (x_begin != x_end);
  }
  return fVar2;
}

Assistant:

float
INTERNAL_NOBLAS(dot)(
    VectorX_Iter x_begin, VectorX_Iter x_end,
    VectorY_Iter y_begin, VectorY_Iter y_end) {
    double dotProduct = 0.0;
    size_t x_size = std::distance(x_begin, x_end);
    size_t y_size = std::distance(y_begin, y_end);
    if (x_size != y_size) {
        std::ostringstream what;
        what << "stl_dot: vector sizes don't match:\n"
            << " x size = " << x_size
            << " y size = " << y_size;
        throw std::invalid_argument(what.str());
    }
    auto x = x_begin;
    auto y = y_begin;
    for (; x != x_end; ++x, ++y) {
        dotProduct += (*x) * (*y);
    }
    return static_cast<float>(dotProduct);
}